

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int wally_descriptor_create_checksum
              (char *descriptor,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t flags,char **output)

{
  char *pcVar1;
  char *local_58;
  char *ignore_checksum_descriptor;
  char checksum [9];
  int ret;
  char **output_local;
  uint32_t flags_local;
  size_t array_len_local;
  char **key_value_array_local;
  char **key_name_array_local;
  char *descriptor_local;
  
  checksum[1] = '\0';
  checksum[2] = '\0';
  checksum[3] = '\0';
  checksum[4] = '\0';
  local_58 = (char *)0x0;
  if (((descriptor == (char *)0x0) || (output == (char **)0x0)) || (flags != 0)) {
    descriptor_local._4_4_ = -2;
  }
  else {
    unique0x10000123 = output;
    wally_bzero((void *)((long)&ignore_checksum_descriptor + 3),9);
    checksum._1_4_ =
         parse_miniscript(descriptor,key_name_array,key_value_array,array_len,0,3,(uint32_t *)0x0,0,
                          0,(wally_descriptor_script_item *)0x0,0,(uint32_t *)0x0,&local_58);
    descriptor_local._4_4_ = checksum._1_4_;
    if (checksum._1_4_ == 0) {
      checksum._1_4_ =
           generate_descriptor_checksum(local_58,(char *)((long)&ignore_checksum_descriptor + 3));
      if (checksum._1_4_ == 0) {
        pcVar1 = wally_strdup((char *)((long)&ignore_checksum_descriptor + 3));
        *stack0xffffffffffffffc0 = pcVar1;
        if (*stack0xffffffffffffffc0 == (char *)0x0) {
          checksum[1] = -3;
          checksum[2] = -1;
          checksum[3] = -1;
          checksum[4] = -1;
        }
      }
      wally_free_string(local_58);
      descriptor_local._4_1_ = checksum[1];
      descriptor_local._5_1_ = checksum[2];
      descriptor_local._6_1_ = checksum[3];
      descriptor_local._7_1_ = checksum[4];
    }
  }
  return descriptor_local._4_4_;
}

Assistant:

int wally_descriptor_create_checksum(
    const char *descriptor,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t flags,
    char **output)
{
    int ret = WALLY_OK;
    char checksum[9];
    char *ignore_checksum_descriptor = NULL;

    if (!descriptor || !output || flags)
        return WALLY_EINVAL;

    wally_bzero(checksum, sizeof(checksum));
    ret = parse_miniscript(
        descriptor,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT | DESCRIPTOR_KIND_DESCRIPTOR,
        NULL,
        0,
        0,
        NULL,
        0,
        NULL,
        &ignore_checksum_descriptor);
    if (ret != WALLY_OK)
        return ret;

    ret = generate_descriptor_checksum(ignore_checksum_descriptor, checksum);
    if (ret == WALLY_OK) {
        *output = wally_strdup(checksum);
        if (*output == NULL)
            ret = WALLY_ENOMEM;
    }
    wally_free_string(ignore_checksum_descriptor);
    return ret;
}